

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O1

size_t ZSTD_compressBlock_doubleFast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  seqDef **ppsVar1;
  BYTE *iEnd;
  long *iStart;
  long *plVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  U32 *pUVar6;
  U32 *pUVar7;
  BYTE *pBVar8;
  BYTE *pBVar9;
  bool bVar10;
  char cVar11;
  uint uVar12;
  BYTE *op;
  long *plVar13;
  BYTE *pBVar14;
  size_t sVar15;
  long lVar16;
  byte bVar17;
  byte bVar18;
  U32 UVar19;
  uint uVar20;
  BYTE *pBVar21;
  ulong uVar22;
  long *plVar23;
  long *plVar24;
  BYTE *pBVar25;
  uint uVar26;
  seqDef *psVar28;
  ulong uVar29;
  long *plVar30;
  long *plVar31;
  U32 UVar32;
  ulong uVar33;
  BYTE *pBVar34;
  U32 UVar35;
  BYTE *ip;
  long *plVar36;
  U32 local_fc;
  ulong uVar27;
  
  iEnd = (BYTE *)((long)src + srcSize);
  plVar2 = (long *)((long)src + (srcSize - 8));
  local_fc = *rep;
  UVar35 = rep[1];
  plVar36 = (long *)src;
  if (src < plVar2) {
    pUVar6 = ms->hashTable;
    pUVar7 = ms->chainTable;
    uVar3 = (ms->window).dictLimit;
    pBVar8 = (ms->window).base;
    pBVar9 = (ms->window).dictBase;
    iStart = (long *)(pBVar8 + uVar3);
    uVar4 = (ms->window).lowLimit;
    plVar13 = (long *)(pBVar9 + uVar4);
    pBVar14 = pBVar9 + uVar3;
    cVar11 = (char)(ms->cParams).chainLog;
    bVar17 = 0x40 - (char)(ms->cParams).hashLog;
    bVar18 = 0x20 - cVar11;
    ppsVar1 = &seqStore->sequences;
    do {
      uVar26 = mls - 5;
      uVar27 = (ulong)uVar26;
      switch(uVar27) {
      case 0:
        lVar16 = -0x30e4432345000000;
        break;
      case 1:
        lVar16 = -0x30e4432340650000;
        break;
      case 2:
        lVar16 = -0x30e44323405a9d00;
        break;
      case 3:
        uVar22 = *src * -0x30e44323485a9b9d;
        goto LAB_004e03dc;
      default:
        uVar22 = (ulong)((uint)((int)*src * -0x61c8864f) >> (bVar18 & 0x1f));
        goto LAB_004e03e4;
      }
      uVar22 = lVar16 * *src;
LAB_004e03dc:
      uVar22 = uVar22 >> (0x40U - cVar11 & 0x3f);
LAB_004e03e4:
      uVar12 = pUVar7[uVar22];
      pBVar21 = pBVar8;
      if (uVar12 < uVar3) {
        pBVar21 = pBVar9;
      }
      lVar16 = *src;
      uVar33 = (ulong)(lVar16 * -0x30e44323485a9b9d) >> (bVar17 & 0x3f);
      uVar5 = pUVar6[uVar33];
      pBVar25 = pBVar8;
      if (uVar5 < uVar3) {
        pBVar25 = pBVar9;
      }
      uVar29 = (long)src - (long)pBVar8;
      UVar32 = (U32)uVar29;
      UVar19 = UVar32 + 1;
      uVar20 = UVar19 - local_fc;
      pUVar6[uVar33] = UVar32;
      pBVar34 = pBVar8;
      if (uVar20 < uVar3) {
        pBVar34 = pBVar9;
      }
      pUVar7[uVar22] = UVar32;
      if ((uVar4 < uVar20 && 2 < (uVar3 - 1) - uVar20) &&
         (*(int *)(pBVar34 + uVar20) == *(int *)((long)src + 1))) {
        plVar31 = (long *)((long)src + 1);
        pBVar21 = iEnd;
        if (uVar20 < uVar3) {
          pBVar21 = pBVar14;
        }
        sVar15 = ZSTD_count_2segments
                           ((BYTE *)((long)src + 5),(BYTE *)((long)(pBVar34 + uVar20) + 4),iEnd,
                            pBVar21,(BYTE *)iStart);
        uVar33 = (long)plVar31 - (long)plVar36;
        plVar24 = (long *)seqStore->lit;
        plVar23 = (long *)((long)plVar24 + uVar33);
        do {
          *plVar24 = *plVar36;
          plVar24 = plVar24 + 1;
          plVar36 = plVar36 + 1;
        } while (plVar24 < plVar23);
        seqStore->lit = seqStore->lit + uVar33;
        if (0xffff < uVar33) {
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        lVar16 = sVar15 + 4;
        uVar22 = sVar15 + 1;
        psVar28 = *ppsVar1;
        psVar28->litLength = (U16)uVar33;
        psVar28->offset = 1;
LAB_004e0978:
        if (0xffff < uVar22) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
        }
        src = (void *)(lVar16 + (long)plVar31);
        psVar28->matchLength = (U16)uVar22;
        *ppsVar1 = psVar28 + 1;
        plVar36 = (long *)src;
        if (src <= plVar2) {
          uVar29 = uVar29 & 0xffffffff;
          if (uVar26 < 4) {
            sVar15 = (*(code *)(&DAT_005f7f40 + *(int *)(&DAT_005f7f40 + uVar27 * 4)))();
            return sVar15;
          }
          pUVar7[(uint)(*(int *)(pBVar8 + uVar29 + 2) * -0x61c8864f) >> (bVar18 & 0x1f)] =
               UVar32 + 2;
          pUVar6[(ulong)(*(long *)(pBVar8 + uVar29 + 2) * -0x30e44323485a9b9d) >> (bVar17 & 0x3f)] =
               UVar32 + 2;
          plVar31 = (long *)((long)src + -2);
          if (uVar26 < 4) {
            sVar15 = (*(code *)(&DAT_005f7f50 + *(int *)(&DAT_005f7f50 + uVar27 * 4)))();
            return sVar15;
          }
          UVar32 = (int)plVar31 - (int)pBVar8;
          pUVar7[(uint)(*(int *)plVar31 * -0x61c8864f) >> (bVar18 & 0x1f)] = UVar32;
          pUVar6[(ulong)(*plVar31 * -0x30e44323485a9b9d) >> (bVar17 & 0x3f)] = UVar32;
          do {
            if (plVar2 < src) break;
            UVar32 = (int)src - (int)pBVar8;
            uVar12 = UVar32 - UVar35;
            pBVar21 = pBVar8;
            if (uVar12 < uVar3) {
              pBVar21 = pBVar9;
            }
            if ((uVar4 < uVar12 && 2 < (uVar3 - 1) - uVar12) &&
               (*(int *)(pBVar21 + uVar12) == (int)*src)) {
              pBVar25 = iEnd;
              if (uVar12 < uVar3) {
                pBVar25 = pBVar14;
              }
              sVar15 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar21 + uVar12) + 4),
                                  iEnd,pBVar25,(BYTE *)iStart);
              *(long *)seqStore->lit = *plVar36;
              psVar28 = seqStore->sequences;
              psVar28->litLength = 0;
              psVar28->offset = 1;
              if (0xffff < sVar15 + 1) {
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar28->matchLength = (U16)(sVar15 + 1);
              seqStore->sequences = psVar28 + 1;
              if (uVar26 < 4) {
                sVar15 = (*(code *)(&DAT_005f7f60 + *(int *)(&DAT_005f7f60 + uVar27 * 4)))();
                return sVar15;
              }
              pUVar7[(uint)((int)*src * -0x61c8864f) >> (bVar18 & 0x1f)] = UVar32;
              pUVar6[(ulong)(*src * -0x30e44323485a9b9d) >> (bVar17 & 0x3f)] = UVar32;
              src = (void *)((long)src + sVar15 + 4);
              bVar10 = true;
              plVar36 = (long *)src;
              UVar32 = UVar35;
              UVar35 = local_fc;
            }
            else {
              bVar10 = false;
              UVar32 = local_fc;
            }
            local_fc = UVar32;
          } while (bVar10);
        }
      }
      else {
        plVar31 = (long *)src;
        if ((uVar4 < uVar5) && (plVar23 = (long *)(pBVar25 + uVar5), *plVar23 == lVar16)) {
          plVar24 = iStart;
          pBVar21 = iEnd;
          if (uVar5 < uVar3) {
            plVar24 = plVar13;
            pBVar21 = pBVar14;
          }
          sVar15 = ZSTD_count_2segments
                             ((BYTE *)((long)src + 8),(BYTE *)(plVar23 + 1),iEnd,pBVar21,
                              (BYTE *)iStart);
          lVar16 = sVar15 + 8;
          if ((plVar24 < plVar23) && (plVar36 < src)) {
            plVar23 = (long *)(pBVar25 + uVar5);
            do {
              plVar30 = (long *)((long)src - 1);
              plVar23 = (long *)((long)plVar23 + -1);
              plVar31 = (long *)src;
              if (((BYTE)*plVar30 != *(BYTE *)plVar23) ||
                 (lVar16 = lVar16 + 1, plVar31 = plVar30, plVar23 <= plVar24)) break;
              src = plVar30;
            } while (plVar36 < plVar30);
          }
          UVar19 = UVar32 - uVar5;
          uVar22 = (long)plVar31 - (long)plVar36;
          plVar24 = (long *)seqStore->lit;
          plVar23 = (long *)((long)plVar24 + uVar22);
          do {
            *plVar24 = *plVar36;
            plVar24 = plVar24 + 1;
            plVar36 = plVar36 + 1;
          } while (plVar24 < plVar23);
          seqStore->lit = seqStore->lit + uVar22;
          if (0xffff < uVar22) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          psVar28 = *ppsVar1;
          psVar28->litLength = (U16)uVar22;
LAB_004e0965:
          uVar22 = lVar16 - 3;
          psVar28->offset = UVar19 + 3;
          UVar35 = local_fc;
          local_fc = UVar19;
          goto LAB_004e0978;
        }
        if ((uVar4 < uVar12) && (plVar23 = (long *)(pBVar21 + uVar12), (int)*plVar23 == (int)*src))
        {
          lVar16 = *(long *)((long)src + 1);
          uVar22 = (ulong)(lVar16 * -0x30e44323485a9b9d) >> (bVar17 & 0x3f);
          uVar5 = pUVar6[uVar22];
          pBVar25 = pBVar8;
          if (uVar5 < uVar3) {
            pBVar25 = pBVar9;
          }
          pUVar6[uVar22] = UVar19;
          if ((uVar4 < uVar5) && (plVar24 = (long *)(pBVar25 + uVar5), *plVar24 == lVar16)) {
            plVar31 = (long *)((long)src + 1);
            plVar23 = iStart;
            pBVar21 = iEnd;
            if (uVar5 < uVar3) {
              plVar23 = plVar13;
              pBVar21 = pBVar14;
            }
            sVar15 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 9),(BYTE *)(plVar24 + 1),iEnd,pBVar21,
                                (BYTE *)iStart);
            lVar16 = sVar15 + 8;
            UVar19 = UVar19 - uVar5;
            if ((plVar23 < plVar24) && (plVar36 < plVar31)) {
              plVar24 = (long *)(pBVar25 + uVar5);
              while (plVar31 = (long *)src, plVar24 = (long *)((long)plVar24 + -1),
                    (BYTE)*plVar31 == *(BYTE *)plVar24) {
                lVar16 = lVar16 + 1;
                if ((plVar24 <= plVar23) || (src = (long *)((long)plVar31 + -1), plVar31 <= plVar36)
                   ) goto LAB_004e08fd;
              }
              plVar31 = (long *)((long)plVar31 + 1);
            }
          }
          else {
            plVar24 = iStart;
            pBVar25 = iEnd;
            if (uVar12 < uVar3) {
              plVar24 = plVar13;
              pBVar25 = pBVar14;
            }
            sVar15 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)plVar23 + 4),iEnd,pBVar25,
                                (BYTE *)iStart);
            lVar16 = sVar15 + 4;
            UVar19 = UVar32 - uVar12;
            if ((plVar24 < plVar23) && (plVar36 < src)) {
              plVar23 = (long *)(pBVar21 + uVar12);
              do {
                plVar30 = (long *)((long)src - 1);
                plVar23 = (long *)((long)plVar23 + -1);
                plVar31 = (long *)src;
                if (((BYTE)*plVar30 != *(BYTE *)plVar23) ||
                   (lVar16 = lVar16 + 1, plVar31 = plVar30, plVar23 <= plVar24)) break;
                src = plVar30;
              } while (plVar36 < plVar30);
            }
          }
LAB_004e08fd:
          uVar22 = (long)plVar31 - (long)plVar36;
          plVar24 = (long *)seqStore->lit;
          plVar23 = (long *)((long)plVar24 + uVar22);
          do {
            *plVar24 = *plVar36;
            plVar24 = plVar24 + 1;
            plVar36 = plVar36 + 1;
          } while (plVar24 < plVar23);
          seqStore->lit = seqStore->lit + uVar22;
          if (0xffff < uVar22) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          psVar28 = *ppsVar1;
          psVar28->litLength = (U16)uVar22;
          goto LAB_004e0965;
        }
        src = (void *)((long)src + ((long)src - (long)plVar36 >> 8) + 1);
      }
    } while (src < plVar2);
  }
  *rep = local_fc;
  rep[1] = UVar35;
  return (long)iEnd - (long)plVar36;
}

Assistant:

static size_t ZSTD_compressBlock_doubleFast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize,
        U32 const mls /* template */)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32* const hashLong = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    const U32   prefixStartIndex = ms->window.dictLimit;
    const BYTE* const base = ms->window.base;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const U32   dictStartIndex = ms->window.lowLimit;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_doubleFast_extDict_generic (srcSize=%zu)", srcSize);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t hSmall = ZSTD_hashPtr(ip, hBitsS, mls);
        const U32 matchIndex = hashSmall[hSmall];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE* match = matchBase + matchIndex;

        const size_t hLong = ZSTD_hashPtr(ip, hBitsL, 8);
        const U32 matchLongIndex = hashLong[hLong];
        const BYTE* const matchLongBase = matchLongIndex < prefixStartIndex ? dictBase : base;
        const BYTE* matchLong = matchLongBase + matchLongIndex;

        const U32 current = (U32)(ip-base);
        const U32 repIndex = current + 1 - offset_1;   /* offset_1 expected <= current +1 */
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        size_t mLength;
        hashSmall[hSmall] = hashLong[hLong] = current;   /* update hash table */

        if ((((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow : ensure repIndex doesn't overlap dict + prefix */
            & (repIndex > dictStartIndex))
          && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            mLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, ip-anchor, anchor, 0, mLength-MINMATCH);
        } else {
            if ((matchLongIndex > dictStartIndex) && (MEM_read64(matchLong) == MEM_read64(ip))) {
                const BYTE* const matchEnd = matchLongIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchLongIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 offset;
                mLength = ZSTD_count_2segments(ip+8, matchLong+8, iend, matchEnd, prefixStart) + 8;
                offset = current - matchLongIndex;
                while (((ip>anchor) & (matchLong>lowMatchPtr)) && (ip[-1] == matchLong[-1])) { ip--; matchLong--; mLength++; }   /* catch up */
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, ip-anchor, anchor, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else if ((matchIndex > dictStartIndex) && (MEM_read32(match) == MEM_read32(ip))) {
                size_t const h3 = ZSTD_hashPtr(ip+1, hBitsL, 8);
                U32 const matchIndex3 = hashLong[h3];
                const BYTE* const match3Base = matchIndex3 < prefixStartIndex ? dictBase : base;
                const BYTE* match3 = match3Base + matchIndex3;
                U32 offset;
                hashLong[h3] = current + 1;
                if ( (matchIndex3 > dictStartIndex) && (MEM_read64(match3) == MEM_read64(ip+1)) ) {
                    const BYTE* const matchEnd = matchIndex3 < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex3 < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+9, match3+8, iend, matchEnd, prefixStart) + 8;
                    ip++;
                    offset = current+1 - matchIndex3;
                    while (((ip>anchor) & (match3>lowMatchPtr)) && (ip[-1] == match3[-1])) { ip--; match3--; mLength++; } /* catch up */
                } else {
                    const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                    offset = current - matchIndex;
                    while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                }
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, ip-anchor, anchor, offset + ZSTD_REP_MOVE, mLength-MINMATCH);

            } else {
                ip += ((ip-anchor) >> kSearchStrength) + 1;
                continue;
        }   }

        /* found a match : store it */
        ip += mLength;
        anchor = ip;

        if (ip <= ilimit) {
            /* Fill Table */
            hashSmall[ZSTD_hashPtr(base+current+2, hBitsS, mls)] = current+2;
            hashLong[ZSTD_hashPtr(base+current+2, hBitsL, 8)] = current+2;
            hashSmall[ZSTD_hashPtr(ip-2, hBitsS, mls)] = (U32)(ip-2-base);
            hashLong[ZSTD_hashPtr(ip-2, hBitsL, 8)] = (U32)(ip-2-base);
            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3)   /* intentional overflow : ensure repIndex2 doesn't overlap dict + prefix */
                    & (repIndex2 > dictStartIndex))
                  && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, 0, repLength2-MINMATCH);
                    hashSmall[ZSTD_hashPtr(ip, hBitsS, mls)] = current2;
                    hashLong[ZSTD_hashPtr(ip, hBitsL, 8)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return iend - anchor;
}